

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O0

CURLcode Curl_input_digest(Curl_easy *data,_Bool proxy,char *header)

{
  int iVar1;
  bool bVar2;
  digestdata *local_30;
  digestdata *digest;
  char *header_local;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  if (proxy) {
    local_30 = &(data->state).proxydigest;
  }
  else {
    local_30 = &(data->state).digest;
  }
  iVar1 = curl_strnequal(header,"Digest",6);
  if ((iVar1 == 0) || ((header[6] != ' ' && (header[6] != '\t')))) {
    data_local._4_4_ = CURLE_BAD_CONTENT_ENCODING;
  }
  else {
    digest = (digestdata *)(header + 6);
    while( true ) {
      bVar2 = false;
      if ((*(char *)&digest->nonce != '\0') && (bVar2 = true, *(char *)&digest->nonce != ' ')) {
        bVar2 = *(char *)&digest->nonce == '\t';
      }
      if (!bVar2) break;
      digest = (digestdata *)((long)&digest->nonce + 1);
    }
    data_local._4_4_ = Curl_auth_decode_digest_http_message((char *)digest,local_30);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_input_digest(struct Curl_easy *data,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header) || !ISBLANK(header[6]))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISBLANK(*header))
    header++;

  return Curl_auth_decode_digest_http_message(header, digest);
}